

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O3

void __thiscall
CStringKMerFactory128::create_kmers_direction
          (CStringKMerFactory128 *this,
          vector<std::pair<unsigned___int128,_bool>,_std::allocator<std::pair<unsigned___int128,_bool>_>_>
          *mers,char *s)

{
  char cVar1;
  byte bVar2;
  undefined8 in_RAX;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool *__args_1;
  byte *pbVar7;
  ulong uVar8;
  __uint128_t *__args;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  undefined8 uStack_38;
  
  *(undefined8 *)((long)&(this->super_KMerFactory128).fkmer + 8) = 0;
  *(undefined8 *)&(this->super_KMerFactory128).rkmer = 0;
  (this->super_KMerFactory128).last_unknown = 0;
  *(undefined8 *)&(this->super_KMerFactory128).fkmer = 0;
  *(undefined8 *)((long)&(this->super_KMerFactory128).rkmer + 8) = 0;
  uVar10 = CONCAT71((int7)((ulong)in_RAX >> 8),*s);
  if (*s != '\0') {
    pbVar7 = (byte *)(s + 1);
    uStack_38 = uVar10;
    do {
      cVar1 = (this->super_KMerFactory128).b2f._M_elems[uVar10 & 0xff];
      uVar5 = (ulong)(this->super_KMerFactory128).rkmer;
      uVar3 = *(long *)((long)&(this->super_KMerFactory128).rkmer + 8) << 2 | uVar5 >> 0x3e;
      uVar5 = uVar5 * 4;
      if (cVar1 == '\x04') {
        uVar6 = uVar5 & (ulong)(this->super_KMerFactory128).KMER_MASK;
        uVar3 = uVar3 & *(ulong *)((long)&(this->super_KMerFactory128).KMER_MASK + 8);
        uVar10 = *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8);
        uVar9 = (ulong)(this->super_KMerFactory128).fkmer >> 2 | uVar10 << 0x3e;
        bVar2 = (byte)(this->super_KMerFactory128).KMER_FIRSTOFFSET;
        uVar11 = 3L << (bVar2 & 0x3f);
        uVar8 = uVar11;
        uVar5 = 0L << (bVar2 & 0x3f) | 3UL >> 0x40 - (bVar2 & 0x3f);
        if ((bVar2 & 0x40) != 0) {
          uVar8 = 0;
          uVar5 = uVar11;
        }
        uVar11 = uVar8 + uVar9;
        uVar10 = uVar5 + (uVar10 >> 2) + (ulong)CARRY8(uVar8,uVar9);
        lVar4 = 0;
      }
      else {
        uVar8 = (ulong)cVar1;
        uVar6 = uVar5 + uVar8 & (ulong)(this->super_KMerFactory128).KMER_MASK;
        uVar3 = uVar3 + ((long)uVar8 >> 0x3f) + (ulong)CARRY8(uVar5,uVar8) &
                *(ulong *)((long)&(this->super_KMerFactory128).KMER_MASK + 8);
        uVar5 = *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8);
        uVar8 = (ulong)(this->super_KMerFactory128).fkmer >> 2 | uVar5 << 0x3e;
        uVar10 = (ulong)(this->super_KMerFactory128).b2r._M_elems[uVar10 & 0xff];
        bVar2 = (byte)(this->super_KMerFactory128).KMER_FIRSTOFFSET;
        uVar11 = uVar10 << (bVar2 & 0x3f);
        bVar12 = (bVar2 & 0x40) != 0;
        uVar10 = ((long)uVar10 >> 0x3f) << (bVar2 & 0x3f) | uVar10 >> 0x40 - (bVar2 & 0x3f);
        if (bVar12) {
          uVar10 = uVar11;
        }
        uVar9 = 0;
        if (!bVar12) {
          uVar9 = uVar11;
        }
        uVar11 = uVar9 + uVar8;
        uVar10 = uVar10 + (uVar5 >> 2) + (ulong)CARRY8(uVar9,uVar8);
        lVar4 = (this->super_KMerFactory128).last_unknown + 1;
      }
      *(ulong *)&(this->super_KMerFactory128).rkmer = uVar6;
      *(ulong *)((long)&(this->super_KMerFactory128).rkmer + 8) = uVar3;
      (this->super_KMerFactory128).last_unknown = lVar4;
      *(ulong *)&(this->super_KMerFactory128).fkmer = uVar11;
      *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8) = uVar10;
      if ((long)(ulong)(this->super_KMerFactory128).K <= lVar4) {
        if (uVar3 < uVar10 || uVar3 - uVar10 < (ulong)(uVar6 < uVar11)) {
          uStack_38._0_7_ = CONCAT16(1,(undefined6)uStack_38);
          __args_1 = (bool *)((long)&uStack_38 + 6);
          __args = &(this->super_KMerFactory128).rkmer;
        }
        else {
          uStack_38 = uStack_38 & 0xffffffffffffff;
          __args_1 = (bool *)((long)&uStack_38 + 7);
          __args = &(this->super_KMerFactory128).fkmer;
        }
        std::
        vector<std::pair<unsigned__int128,bool>,std::allocator<std::pair<unsigned__int128,bool>>>::
        emplace_back<unsigned__int128&,bool>
                  ((vector<std::pair<unsigned__int128,bool>,std::allocator<std::pair<unsigned__int128,bool>>>
                    *)mers,__args,__args_1);
      }
      bVar2 = *pbVar7;
      uVar10 = (ulong)bVar2;
      pbVar7 = pbVar7 + 1;
    } while (bVar2 != 0);
  }
  return;
}

Assistant:

const void create_kmers_direction(std::vector<std::pair<__uint128_t,bool>> &mers, const char * s) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        while (s[p]!='\0') {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                if (fkmer <= rkmer) {
                    // Is fwd
                    mers.emplace_back(fkmer,false);
                } else {
                    // Is bwd
                    mers.emplace_back(rkmer,true);
                }
            }
        }
    }